

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::BrEnvProperty
          (ByteCodeWriter *this,OpCode op,ByteCodeLabel labelID,PropertyIdIndexType index,
          int32 slotIndex)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  undefined4 *puVar3;
  undefined2 local_3a;
  PropertyIdIndexType local_38;
  undefined1 auStack_34 [2];
  OpLayoutBrEnvProperty data;
  size_t offsetOfRelativeJumpOffsetFromEnd;
  int32 local_20;
  PropertyIdIndexType local_1c;
  int32 slotIndex_local;
  PropertyIdIndexType index_local;
  ByteCodeLabel labelID_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  local_20 = slotIndex;
  local_1c = index;
  slotIndex_local = labelID;
  index_local._2_2_ = op;
  _labelID_local = this;
  CheckOpen(this);
  op_00 = index_local._2_2_;
  OpLayoutType::OpLayoutType
            ((OpLayoutType *)((long)&offsetOfRelativeJumpOffsetFromEnd + 4),BrEnvProperty);
  CheckOp(this,op_00,offsetOfRelativeJumpOffsetFromEnd._4_4_);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(index_local._2_2_);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x396,"(!OpCodeAttr::HasMultiSizeLayout(op))",
                                "!OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  CheckLabel(this,slotIndex_local);
  data.PropertyIdIndex = 10;
  data.SlotIndex = 0;
  local_3a = 10;
  _auStack_34 = local_20;
  local_38 = local_1c;
  Data::Encode(&this->m_byteCodeData,index_local._2_2_,&local_3a,10,this);
  AddJumpOffset(this,index_local._2_2_,slotIndex_local,10);
  return;
}

Assistant:

void ByteCodeWriter::BrEnvProperty(OpCode op, ByteCodeLabel labelID, PropertyIdIndexType index, int32 slotIndex)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::BrEnvProperty);
        Assert(!OpCodeAttr::HasMultiSizeLayout(op));
        CheckLabel(labelID);

        size_t const offsetOfRelativeJumpOffsetFromEnd = sizeof(OpLayoutBrEnvProperty) - offsetof(OpLayoutBrEnvProperty, RelativeJumpOffset);
        OpLayoutBrEnvProperty data;
        data.RelativeJumpOffset = offsetOfRelativeJumpOffsetFromEnd;
        data.SlotIndex = slotIndex;
        data.PropertyIdIndex = index;

        m_byteCodeData.Encode(op, &data, sizeof(data), this);
        AddJumpOffset(op, labelID, offsetOfRelativeJumpOffsetFromEnd);
    }